

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::set_allocated_scene
          (VisionFeaturePrint *this,VisionFeaturePrint_Scene *scene)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_VisionFeaturePrintType(this);
  if (scene != (VisionFeaturePrint_Scene *)0x0) {
    submessage_arena = (Arena *)(scene->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      scene = (VisionFeaturePrint_Scene *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (message_arena,&scene->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x14;
    (this->VisionFeaturePrintType_).scene_ = scene;
  }
  return;
}

Assistant:

void VisionFeaturePrint::set_allocated_scene(::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene* scene) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_VisionFeaturePrintType();
  if (scene) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>::GetOwningArena(scene);
    if (message_arena != submessage_arena) {
      scene = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, scene, submessage_arena);
    }
    set_has_scene();
    VisionFeaturePrintType_.scene_ = scene;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CoreMLModels.VisionFeaturePrint.scene)
}